

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::merkle_tree::blocks_verified(merkle_tree *this,int block_idx,int num_blocks)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  switch(this->m_mode) {
  case empty_tree:
    bVar4 = this->m_num_blocks == 1;
    break;
  case full_tree:
    if (num_blocks < 1) {
      return true;
    }
    iVar2 = num_blocks + block_idx;
    do {
      iVar1 = block_idx + 0x1f;
      if (-1 < block_idx) {
        iVar1 = block_idx;
      }
      uVar3 = 0x80000000 >> ((byte)block_idx & 0x1f);
      bVar4 = (*(uint *)((long)(this->m_block_verified).m_buf.
                               super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                               ._M_t.
                               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                               .super__Head_base<0UL,_unsigned_int_*,_false> + 4 +
                        (long)(iVar1 >> 5) * 4) &
              (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)) !=
              0;
    } while ((bVar4) && (block_idx = block_idx + 1, block_idx < iVar2));
    return bVar4;
  case piece_layer:
    bVar4 = this->m_blocks_per_piece_log == '\0';
    break;
  case block_layer:
    return true;
  default:
    return false;
  }
  return bVar4;
}

Assistant:

bool merkle_tree::blocks_verified(int block_idx, int num_blocks) const
	{
		TORRENT_ASSERT(num_blocks > 0);
		TORRENT_ASSERT(block_idx < m_num_blocks);
		TORRENT_ASSERT(block_idx + num_blocks <= m_num_blocks);
		switch (m_mode)
		{
			case mode_t::uninitialized_tree:
				return false;
			case mode_t::empty_tree:
				return m_num_blocks == 1;
			case mode_t::piece_layer:
				return piece_levels() == 0;
			case mode_t::block_layer:
				return true;
			case mode_t::full_tree:
				for (int i = block_idx; i < block_idx + num_blocks; ++i)
					if (!m_block_verified.get_bit(i)) return false;
				return true;
		}
		TORRENT_ASSERT_FAIL();
		return false;
	}